

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diffuselight.hpp
# Opt level: O0

Color __thiscall
DiffuseLight::sampleIrradiance
          (DiffuseLight *this,point *surface,vec3f *dirToLight,float *dist,Sampler *sampler)

{
  float *in_RCX;
  vec3f *in_RDX;
  vec3f *in_RDI;
  undefined8 in_R8;
  float fVar1;
  float fVar2;
  vec3f *pvVar3;
  vec3f vVar4;
  Color CVar5;
  float t;
  SampleInfo info;
  float k;
  vec3f local_d0;
  vec3f local_c0;
  float local_b4;
  vec3f local_b0;
  vec3f local_a0;
  undefined8 local_90;
  float local_88;
  undefined8 local_80;
  float local_78;
  vec3f local_70;
  undefined8 local_60;
  float local_58;
  vec3f local_54;
  vec3f local_48;
  float local_3c;
  float *local_30;
  vec3f *local_28;
  undefined8 uVar6;
  float fVar7;
  
  pvVar3 = &local_54;
  local_30 = in_RCX;
  local_28 = in_RDX;
  (**(code **)(**(long **)(in_RDI + 2) + 0x10))(pvVar3,*(long **)(in_RDI + 2),in_R8);
  vVar4 = ::operator-(in_RDI,pvVar3);
  local_70.z = vVar4.z;
  local_58 = local_70.z;
  local_70._0_8_ = vVar4._0_8_;
  local_60._0_4_ = local_70.x;
  local_60._4_4_ = local_70.y;
  local_70 = vVar4;
  fVar1 = norm((vec3f *)0x1150ed);
  *local_30 = fVar1;
  vVar4 = ::operator-(in_RDI,pvVar3);
  local_a0.z = vVar4.z;
  local_88 = local_a0.z;
  local_a0._0_8_ = vVar4._0_8_;
  local_90._0_4_ = local_a0.x;
  local_90._4_4_ = local_a0.y;
  local_a0 = vVar4;
  vVar4 = normalized(in_RDI);
  local_b0.z = vVar4.z;
  local_78 = local_b0.z;
  local_b0._0_8_ = vVar4._0_8_;
  local_80._0_4_ = local_b0.x;
  local_80._4_4_ = local_b0.y;
  local_28->z = local_b0.z;
  local_28->x = local_b0.x;
  local_28->y = local_b0.y;
  local_b0 = vVar4;
  fVar1 = dot(&local_48,local_28);
  vVar4 = ::operator-(in_RDI,pvVar3);
  k = SUB84(pvVar3,0);
  local_d0._0_8_ = vVar4._0_8_;
  local_c0.x = local_d0.x;
  local_c0.y = local_d0.y;
  local_d0.z = vVar4.z;
  local_c0.z = local_d0.z;
  fVar2 = sqrlen(&local_c0);
  local_3c = (fVar1 / fVar2) / local_3c;
  if (in_RDI[2].z == 0.0) {
    pvVar3 = (vec3f *)ABS((double)local_3c);
  }
  else {
    pvVar3 = (vec3f *)(double)(local_3c * (float)(int)in_RDI[2].z);
    if ((double)pvVar3 <= 0.0) {
      pvVar3 = (vec3f *)0x0;
    }
  }
  local_b4 = (float)(double)pvVar3;
  vVar4 = ::operator*(k,pvVar3);
  CVar5.x = vVar4.x;
  uVar6._4_4_ = vVar4.y;
  register0x00001240 = vVar4.z;
  return CVar5;
}

Assistant:

Color sampleIrradiance(const point& surface, vec3f& dirToLight, float& dist, Sampler& sampler) const
	{
		assert(samplable);
		auto info = base->sampleSurface(sampler);
		dist = norm(info.p - surface);
		dirToLight = normalized(info.p - surface);
		float t = dot(info.normal, dirToLight) / sqrlen(info.p - surface) / info.pdf;
		t = sampleside? fmax(t*sampleside, 0): fabs(t);
		return t * _radiance;
	}